

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_dse_fstore(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  ushort uVar3;
  AliasRet AVar4;
  TRef TVar5;
  IRIns *refa;
  IRIns *pIVar6;
  IRIns *pIVar7;
  IRRef1 *pIVar8;
  
  uVar1 = (J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  pIVar6 = (J->cur).ir;
  refa = pIVar6 + uVar1;
  pIVar8 = J->chain + 0x4d;
  while( true ) {
    uVar3 = *pIVar8;
    if (uVar3 <= uVar1) break;
    pIVar7 = pIVar6 + uVar3;
    AVar4 = aa_fref(J,refa,pIVar6 + (pIVar7->field_0).op1);
    if (AVar4 == ALIAS_MAY) {
      if ((pIVar7->field_0).op2 != IVar2) break;
    }
    else if (AVar4 == ALIAS_MUST) {
      if (((pIVar7->field_0).op2 == IVar2) && (5 < (ushort)((refa->field_0).op2 - 0x10))) {
        return 4;
      }
      if (J->chain[0x11] < uVar3) {
        pIVar6 = pIVar6 + ((J->cur).nins - 1);
        goto LAB_00123ead;
      }
      break;
    }
    pIVar8 = &(pIVar7->field_0).prev;
  }
LAB_00123ef8:
  TVar5 = lj_ir_emit(J);
  return TVar5;
LAB_00123ead:
  if (pIVar6 <= pIVar7) goto LAB_00123ee0;
  if (((char)(pIVar6->field_1).t.irt < '\0') ||
     (((pIVar6->field_1).o == 'E' && ((pIVar6->field_0).op2 == (refa->field_0).op2))))
  goto LAB_00123ef8;
  pIVar6 = pIVar6 + -1;
  goto LAB_00123ead;
LAB_00123ee0:
  *pIVar8 = (pIVar7->field_0).prev;
  *pIVar7 = (IRIns)0xc0000000000;
  goto LAB_00123ef8;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val &&
	  !(xr->op2 >= IRFL_SBUF_W && xr->op2 <= IRFL_SBUF_R))
	return DROPFOLD;  /* Same value: drop the new store. */
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}